

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

_Bool MatrixCompareLoose(Matrix *a,Matrix *b,Real error)

{
  Matrix *pMVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar2;
  uint local_40;
  uint local_3c;
  uint32_t col;
  uint32_t row;
  Real error_local;
  Matrix *b_local;
  Matrix *a_local;
  
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    lVar2 = in_ST6;
    for (local_3c = 0; local_3c < a->rows; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < a->columns; local_40 = local_40 + 1) {
        pMVar1 = a;
        MatrixGetElement((Real *)a,(Matrix *)(ulong)local_3c,local_40,(uint32_t)a);
        MatrixGetElement((Real *)b,(Matrix *)(ulong)local_3c,local_40,(uint32_t)pMVar1);
        if (error._0_10_ <= ABS(in_ST0 - in_ST1)) {
          return false;
        }
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = in_ST6;
        in_ST5 = lVar2;
        in_ST6 = lVar2;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompareLoose",(ulong)a->rows,
            (ulong)a->columns,(ulong)b->rows,b->columns);
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool MatrixCompareLoose(const Matrix *a, const Matrix *b, Real error) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  for (uint32_t row = 0; row < a->rows; ++row) {
    for (uint32_t col = 0; col < a->columns; ++col) {
      if (fabsl(MatrixGetElement(a, row, col) - MatrixGetElement(b, row, col)) >= error) {
        return false;
      }
    }
  }
  return true;
}